

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ValueColor(char *prefix,ImU32 v)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec4 col;
  ImVec4 local_18;
  
  Text("%s: %08X",prefix,v);
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar2->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  local_18.y = (float)(v >> 8 & 0xff) / 255.0;
  local_18.x = (float)(v & 0xff) / 255.0;
  local_18.w = (float)(v >> 0x18) / 255.0;
  local_18.z = (float)(v >> 0x10 & 0xff) / 255.0;
  ColorButton(&local_18,true,true);
  return;
}

Assistant:

void ImGui::ValueColor(const char* prefix, ImU32 v)
{
    Text("%s: %08X", prefix, v);
    SameLine();

    ImVec4 col;
    col.x = (float)((v >> 0) & 0xFF) / 255.0f;
    col.y = (float)((v >> 8) & 0xFF) / 255.0f;
    col.z = (float)((v >> 16) & 0xFF) / 255.0f;
    col.w = (float)((v >> 24) & 0xFF) / 255.0f;
    ColorButton(col, true);
}